

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_init_riscv32(CPUState_conflict *cpu)

{
  void *pvVar1;
  int64_t iVar2;
  CPUTLBEntry *pCVar3;
  CPUIOTLBEntry *pCVar4;
  CPUTLBDescFast *fast;
  long lVar5;
  CPUTLBDesc_conflict *desc;
  bool bVar6;
  
  pvVar1 = cpu->env_ptr;
  iVar2 = get_clock_realtime();
  *(undefined2 *)((long)pvVar1 + -0xb30) = 0;
  desc = (CPUTLBDesc_conflict *)((long)pvVar1 + -0xb10);
  fast = (CPUTLBDescFast *)((long)pvVar1 + -0x50);
  lVar5 = 4;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    desc->window_begin_ns = iVar2;
    desc->window_max_entries = 0;
    desc->n_used_entries = 0;
    fast->mask = 0x3fc0;
    pCVar3 = (CPUTLBEntry *)g_malloc(0x4000);
    fast->table = pCVar3;
    pCVar4 = (CPUIOTLBEntry *)g_malloc(0x1000);
    desc->iotlb = pCVar4;
    tlb_mmu_flush_locked(desc,fast);
    fast = fast + 1;
    desc = desc + 1;
  }
  return;
}

Assistant:

void tlb_init(CPUState *cpu)
{
    CPUArchState *env = cpu->env_ptr;
    int64_t now = get_clock_realtime();
    int i;

    /* All tlbs are initialized flushed. */
    env_tlb(env)->c.dirty = 0;

    for (i = 0; i < NB_MMU_MODES; i++) {
        tlb_mmu_init(&env_tlb(env)->d[i], &env_tlb(env)->f[i], now);
    }
}